

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_sse2.c
# Opt level: O3

void aom_fft_unpack_2d_output_sse2(float *packed,float *output,int n)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  float *pfVar26;
  long lVar27;
  float *pfVar28;
  float *pfVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  float *pfVar34;
  long lVar35;
  uint uVar36;
  ulong uVar37;
  float *pfVar38;
  float *pfVar39;
  ulong uVar40;
  float *pfVar41;
  float *pfVar42;
  uint local_124;
  float *local_108;
  long local_f8;
  float *local_f0;
  float *local_e8;
  float *local_e0;
  float *local_d8;
  float *local_d0;
  float *local_c8;
  
  uVar22 = n / 2;
  *output = *packed;
  output[1] = 0.0;
  lVar21 = (long)(int)uVar22;
  uVar23 = uVar22 * n;
  output[(int)(uVar23 * 2)] = packed[(int)uVar23];
  output[(int)(uVar23 * 2 + 1)] = 0.0;
  uVar36 = n - (n >> 0x1f) & 0xfffffffe;
  output[(int)uVar36] = packed[lVar21];
  output[(int)(uVar36 + 1)] = 0.0;
  iVar20 = uVar22 + uVar23;
  output[iVar20 * 2] = packed[iVar20];
  output[iVar20 * 2 + 1] = 0.0;
  if (3 < n) {
    uVar24 = (ulong)uVar23;
    uVar33 = 2;
    if (2 < (int)uVar22) {
      uVar33 = (ulong)uVar22;
    }
    lVar35 = 0;
    do {
      *(undefined4 *)((long)output + lVar35 * 2 + 8) = *(undefined4 *)((long)packed + lVar35 + 4);
      *(undefined4 *)((long)output + lVar35 * 2 + 0xc) =
           *(undefined4 *)((long)packed + lVar35 + lVar21 * 4 + 4);
      *(undefined4 *)((long)output + lVar35 * 2 + uVar24 * 8 + 8) =
           *(undefined4 *)((long)packed + lVar35 + uVar24 * 4 + 4);
      *(undefined4 *)((long)output + lVar35 * 2 + uVar24 * 8 + 0xc) =
           *(undefined4 *)((long)packed + lVar35 + lVar21 * 4 + uVar24 * 4 + 4);
      lVar35 = lVar35 + 4;
    } while (uVar33 * 4 + -4 != lVar35);
    if (3 < n) {
      uVar23 = 4;
      if ((int)uVar22 < 4) {
        uVar23 = uVar22;
      }
      uVar24 = (ulong)uVar23;
      if ((int)uVar23 < 3) {
        uVar24 = 2;
      }
      uVar37 = (ulong)(uint)n;
      uVar33 = 2;
      if (2 < (int)uVar22) {
        uVar33 = (ulong)uVar22;
      }
      lVar19 = (ulong)uVar22 * 4 + 4;
      local_124 = (uVar22 + 1) * n;
      lVar3 = uVar24 * 4 + -4;
      lVar25 = uVar37 << 0x21;
      lVar35 = lVar25 + 0xc00000000;
      lVar31 = (lVar21 + 1) * uVar37;
      local_c8 = packed + lVar31;
      local_d0 = packed + lVar31 + lVar21;
      pfVar26 = output + lVar31 * 2 + 3;
      local_d8 = output + lVar31 * 2;
      local_f8 = (lVar31 << 0x21) + 0xc00000000;
      local_e0 = packed + lVar21 + uVar37;
      lVar31 = (uVar37 - 1) * uVar37;
      lVar32 = ((uVar37 - 1) - lVar21) * uVar37;
      pfVar41 = packed + lVar31 + 1;
      local_108 = packed + lVar31;
      pfVar29 = packed + lVar31 + lVar21 + 1;
      pfVar28 = packed + lVar31 + lVar21;
      pfVar42 = packed + lVar32 + 1;
      pfVar39 = packed + lVar32;
      pfVar38 = packed + lVar32 + lVar21 + 1;
      pfVar34 = packed + lVar32 + lVar21;
      local_e8 = output + uVar37 * 2;
      local_f0 = packed + uVar37;
      uVar24 = 1;
      uVar22 = n;
      do {
        uVar40 = (ulong)uVar22;
        lVar32 = uVar24 * uVar37;
        output[lVar32 * 2] = packed[lVar32];
        lVar30 = (uVar24 + lVar21) * uVar37;
        output[lVar32 * 2 + 1] = packed[lVar30];
        lVar32 = lVar32 + lVar21;
        output[lVar32 * 2] = packed[lVar32];
        lVar31 = lVar21 + lVar30;
        output[lVar32 * 2 + 1] = packed[lVar31];
        lVar32 = 0;
        do {
          *(float *)((long)output + lVar32 * 2 + uVar40 * 8 + 8) =
               *(float *)((long)packed + lVar32 + uVar40 * 4 + 4) -
               *(float *)((long)packed + lVar32 + (ulong)local_124 * 4 + lVar19);
          *(float *)((long)output + lVar32 * 2 + uVar40 * 8 + 0xc) =
               *(float *)((long)packed + lVar32 + (ulong)local_124 * 4 + 4) +
               *(float *)((long)packed + lVar32 + uVar40 * 4 + lVar19);
          lVar32 = lVar32 + 4;
        } while (lVar3 != lVar32);
        if (9 < (uint)n) {
          lVar27 = 4;
          lVar32 = lVar35;
          do {
            pfVar2 = local_f0 + lVar27;
            fVar5 = pfVar2[1];
            fVar6 = pfVar2[2];
            fVar7 = pfVar2[3];
            pfVar1 = local_c8 + lVar27;
            fVar8 = *pfVar1;
            fVar9 = pfVar1[1];
            fVar10 = pfVar1[2];
            fVar11 = pfVar1[3];
            pfVar4 = local_d0 + lVar27;
            fVar12 = pfVar4[1];
            fVar13 = pfVar4[2];
            fVar14 = pfVar4[3];
            pfVar1 = local_e0 + lVar27;
            fVar15 = *pfVar1;
            fVar16 = pfVar1[1];
            fVar17 = pfVar1[2];
            fVar18 = pfVar1[3];
            pfVar1 = local_e8 + lVar27 * 2;
            *pfVar1 = *pfVar2 - *pfVar4;
            pfVar1[1] = fVar8 + fVar15;
            pfVar1[2] = fVar5 - fVar12;
            pfVar1[3] = fVar9 + fVar16;
            pfVar2 = (float *)((long)output + (lVar32 >> 0x1e));
            *pfVar2 = fVar6 - fVar13;
            pfVar2[1] = fVar10 + fVar17;
            pfVar2[2] = fVar7 - fVar14;
            pfVar2[3] = fVar11 + fVar18;
            lVar27 = lVar27 + 4;
            lVar32 = lVar32 + 0x800000000;
          } while (lVar27 < lVar21);
        }
        lVar27 = uVar37 - (uVar24 + lVar21);
        lVar32 = lVar27 * uVar37;
        output[lVar30 * 2] = packed[lVar32];
        lVar27 = (lVar27 + lVar21) * uVar37;
        output[lVar30 * 2 + 1] = -packed[lVar27];
        output[lVar31 * 2] = packed[lVar21 + lVar32];
        output[lVar31 * 2 + 1] = -packed[lVar21 + lVar27];
        lVar31 = 0;
        do {
          *(float *)((long)pfVar26 + lVar31 * 2 + -4) =
               *(float *)((long)pfVar42 + lVar31) + *(float *)((long)pfVar29 + lVar31);
          *(float *)((long)pfVar26 + lVar31 * 2) =
               *(float *)((long)pfVar38 + lVar31) - *(float *)((long)pfVar41 + lVar31);
          lVar31 = lVar31 + 4;
        } while (lVar3 != lVar31);
        if (9 < (uint)n) {
          lVar32 = 4;
          lVar31 = local_f8;
          do {
            pfVar2 = pfVar39 + lVar32;
            fVar5 = pfVar2[1];
            fVar6 = pfVar2[2];
            fVar7 = pfVar2[3];
            pfVar1 = pfVar34 + lVar32;
            fVar8 = *pfVar1;
            fVar9 = pfVar1[1];
            fVar10 = pfVar1[2];
            fVar11 = pfVar1[3];
            pfVar4 = pfVar28 + lVar32;
            fVar12 = pfVar4[1];
            fVar13 = pfVar4[2];
            fVar14 = pfVar4[3];
            pfVar1 = local_108 + lVar32;
            fVar15 = *pfVar1;
            fVar16 = pfVar1[1];
            fVar17 = pfVar1[2];
            fVar18 = pfVar1[3];
            pfVar1 = local_d8 + lVar32 * 2;
            *pfVar1 = *pfVar2 + *pfVar4;
            pfVar1[1] = fVar8 - fVar15;
            pfVar1[2] = fVar5 + fVar12;
            pfVar1[3] = fVar9 - fVar16;
            pfVar2 = (float *)((long)output + (lVar31 >> 0x1e));
            *pfVar2 = fVar6 + fVar13;
            pfVar2[1] = fVar10 - fVar17;
            pfVar2[2] = fVar7 + fVar14;
            pfVar2[3] = fVar11 - fVar18;
            lVar32 = lVar32 + 4;
            lVar31 = lVar31 + 0x800000000;
          } while (lVar32 < lVar21);
        }
        uVar24 = uVar24 + 1;
        local_124 = local_124 + n;
        uVar22 = uVar22 + n;
        local_e8 = local_e8 + uVar37 * 2;
        lVar35 = lVar35 + lVar25;
        local_c8 = local_c8 + uVar37;
        local_d0 = local_d0 + uVar37;
        local_f0 = local_f0 + uVar37;
        local_e0 = local_e0 + uVar37;
        pfVar26 = pfVar26 + uVar37 * 2;
        pfVar29 = pfVar29 + -uVar37;
        pfVar41 = pfVar41 + -uVar37;
        pfVar38 = pfVar38 + -uVar37;
        pfVar42 = pfVar42 + -uVar37;
        local_d8 = local_d8 + uVar37 * 2;
        local_f8 = local_f8 + lVar25;
        local_108 = local_108 + -uVar37;
        pfVar28 = pfVar28 + -uVar37;
        pfVar39 = pfVar39 + -uVar37;
        pfVar34 = pfVar34 + -uVar37;
      } while (uVar24 != uVar33);
    }
  }
  return;
}

Assistant:

void aom_fft_unpack_2d_output_sse2(const float *packed, float *output, int n) {
  const int n2 = n / 2;
  output[0] = packed[0];
  output[1] = 0;
  output[2 * (n2 * n)] = packed[n2 * n];
  output[2 * (n2 * n) + 1] = 0;

  output[2 * n2] = packed[n2];
  output[2 * n2 + 1] = 0;
  output[2 * (n2 * n + n2)] = packed[n2 * n + n2];
  output[2 * (n2 * n + n2) + 1] = 0;

  for (int c = 1; c < n2; ++c) {
    output[2 * (0 * n + c)] = packed[c];
    output[2 * (0 * n + c) + 1] = packed[c + n2];
    output[2 * (n2 * n + c) + 0] = packed[n2 * n + c];
    output[2 * (n2 * n + c) + 1] = packed[n2 * n + c + n2];
  }
  for (int r = 1; r < n2; ++r) {
    output[2 * (r * n + 0)] = packed[r * n];
    output[2 * (r * n + 0) + 1] = packed[(r + n2) * n];
    output[2 * (r * n + n2) + 0] = packed[r * n + n2];
    output[2 * (r * n + n2) + 1] = packed[(r + n2) * n + n2];

    for (int c = 1; c < AOMMIN(n2, 4); ++c) {
      output[2 * (r * n + c)] =
          packed[r * n + c] - packed[(r + n2) * n + c + n2];
      output[2 * (r * n + c) + 1] =
          packed[(r + n2) * n + c] + packed[r * n + c + n2];
    }

    for (int c = 4; c < n2; c += 4) {
      __m128 real1 = _mm_load_ps(packed + r * n + c);
      __m128 real2 = _mm_load_ps(packed + (r + n2) * n + c + n2);
      __m128 imag1 = _mm_load_ps(packed + (r + n2) * n + c);
      __m128 imag2 = _mm_load_ps(packed + r * n + c + n2);
      real1 = _mm_sub_ps(real1, real2);
      imag1 = _mm_add_ps(imag1, imag2);
      _mm_store_ps(output + 2 * (r * n + c), _mm_unpacklo_ps(real1, imag1));
      _mm_store_ps(output + 2 * (r * n + c + 2), _mm_unpackhi_ps(real1, imag1));
    }

    int r2 = r + n2;
    int r3 = n - r2;
    output[2 * (r2 * n + 0)] = packed[r3 * n];
    output[2 * (r2 * n + 0) + 1] = -packed[(r3 + n2) * n];
    output[2 * (r2 * n + n2)] = packed[r3 * n + n2];
    output[2 * (r2 * n + n2) + 1] = -packed[(r3 + n2) * n + n2];
    for (int c = 1; c < AOMMIN(4, n2); ++c) {
      output[2 * (r2 * n + c)] =
          packed[r3 * n + c] + packed[(r3 + n2) * n + c + n2];
      output[2 * (r2 * n + c) + 1] =
          -packed[(r3 + n2) * n + c] + packed[r3 * n + c + n2];
    }
    for (int c = 4; c < n2; c += 4) {
      __m128 real1 = _mm_load_ps(packed + r3 * n + c);
      __m128 real2 = _mm_load_ps(packed + (r3 + n2) * n + c + n2);
      __m128 imag1 = _mm_load_ps(packed + (r3 + n2) * n + c);
      __m128 imag2 = _mm_load_ps(packed + r3 * n + c + n2);
      real1 = _mm_add_ps(real1, real2);
      imag1 = _mm_sub_ps(imag2, imag1);
      _mm_store_ps(output + 2 * (r2 * n + c), _mm_unpacklo_ps(real1, imag1));
      _mm_store_ps(output + 2 * (r2 * n + c + 2),
                   _mm_unpackhi_ps(real1, imag1));
    }
  }
}